

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O2

int comparepoints(void *arg1,void *arg2)

{
  long lVar1;
  long lVar2;
  int iVar3;
  char *__s1;
  char *__s2;
  
  lVar1 = *arg1;
  lVar2 = *arg2;
  if (deathmatch.Value == 0) {
    iVar3 = *(int *)(lVar2 + 0xf8) - *(int *)(lVar1 + 0xf8);
  }
  else {
    iVar3 = *(int *)(lVar2 + 0xc4) - *(int *)(lVar1 + 0xc4);
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  __s1 = userinfo_t::GetName((userinfo_t *)(lVar1 + 0x38));
  __s2 = userinfo_t::GetName((userinfo_t *)(lVar2 + 0x38));
  iVar3 = strcasecmp(__s1,__s2);
  return iVar3;
}

Assistant:

int comparepoints (const void *arg1, const void *arg2)
{
	// Compare first be frags/kills, then by name.
	player_t *p1 = *(player_t **)arg1;
	player_t *p2 = *(player_t **)arg2;
	int diff;

	diff = deathmatch ? p2->fragcount - p1->fragcount : p2->killcount - p1->killcount;
	if (diff == 0)
	{
		diff = stricmp(p1->userinfo.GetName(), p2->userinfo.GetName());
	}
	return diff;
}